

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entt.hpp
# Opt level: O0

size_t entt::next_power_of_two(size_t value)

{
  int local_1c;
  ulong uStack_18;
  int next;
  size_t curr;
  size_t value_local;
  
  if (value < 0x8000000000000000) {
    uStack_18 = value - (value != 0);
    for (local_1c = 1; local_1c < 0x40; local_1c = local_1c << 1) {
      uStack_18 = uStack_18 >> ((byte)local_1c & 0x3f) | uStack_18;
    }
    return uStack_18 + 1;
  }
  __assert_fail("value < (std::size_t{1u} << (std::numeric_limits<std::size_t>::digits - 1))",
                "/workspace/llm4binary/github/license_c_cmakelists/Green-Sky[P]imgui_entt_entity_editor_demo/external/entt/./single_include/entt/entt.hpp"
                ,0x4ca,"std::size_t entt::next_power_of_two(const std::size_t)");
}

Assistant:

[[nodiscard]] inline constexpr std::size_t next_power_of_two(const std::size_t value) ENTT_NOEXCEPT {
    ENTT_ASSERT(value < (std::size_t{1u} << (std::numeric_limits<std::size_t>::digits - 1)), "Numeric limits exceeded");
    std::size_t curr = value - (value != 0u);

    for(int next = 1; next < std::numeric_limits<std::size_t>::digits; next = next * 2) {
        curr |= curr >> next;
    }

    return ++curr;
}